

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O0

void __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::visit
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VRLocation *loc)

{
  bool bVar1;
  VRLocation *in_RDI;
  SimpleVisit *unaff_retaddr;
  
  while( true ) {
    bVar1 = SimpleVisit::wasVisited(unaff_retaddr,in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    SimpleVisit::find(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void visit(VRLocation *loc) {
            while (!Visit::wasVisited(loc))
                Visit::find(loc);
        }